

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void updateCursorImage(_GLFWwindow *window)

{
  _GLFWwindow *window_local;
  
  if (window->cursorMode == 0x34001) {
    if (window->cursor == (_GLFWcursor *)0x0) {
      XUndefineCursor(_glfw.x11.display,(window->x11).handle);
    }
    else {
      XDefineCursor(_glfw.x11.display,(window->x11).handle,(window->cursor->x11).handle);
    }
  }
  else {
    XDefineCursor(_glfw.x11.display,(window->x11).handle,_glfw.x11.cursor);
  }
  return;
}

Assistant:

static void updateCursorImage(_GLFWwindow* window)
{
    if (window->cursorMode == GLFW_CURSOR_NORMAL)
    {
        if (window->cursor)
        {
            XDefineCursor(_glfw.x11.display, window->x11.handle,
                          window->cursor->x11.handle);
        }
        else
            XUndefineCursor(_glfw.x11.display, window->x11.handle);
    }
    else
        XDefineCursor(_glfw.x11.display, window->x11.handle, _glfw.x11.cursor);
}